

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double r8vec_length(int dim_num,double *x)

{
  __type _Var1;
  double dVar2;
  double local_28;
  double value;
  int i;
  double *x_local;
  int dim_num_local;
  
  local_28 = 0.0;
  for (value._4_4_ = 0; value._4_4_ < dim_num; value._4_4_ = value._4_4_ + 1) {
    _Var1 = std::pow<double,int>(x[value._4_4_],2);
    local_28 = local_28 + _Var1;
  }
  dVar2 = sqrt(local_28);
  return dVar2;
}

Assistant:

double r8vec_length ( int dim_num, double x[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC_LENGTH returns the Euclidean length of an R8VEC
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    08 August 2005
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int DIM_NUM, the spatial dimension.
//
//    Input, double X[DIM_NUM], the vector.
//
//    Output, double R8VEC_LENGTH, the Euclidean length of the vector.
//
{
  int i;
  double value;

  value = 0.0;
  for ( i = 0; i < dim_num; i++ )
  {
    value = value + pow ( x[i], 2 );
  }
  value = sqrt ( value );

  return value;
}